

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomItem::write(DomItem *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  DomProperty **ppDVar3;
  DomItem **ppDVar4;
  size_t sVar5;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  DomItem *v_1;
  QList<DomItem_*> *__range1_1;
  DomProperty *v;
  QList<DomProperty_*> *__range1;
  char16_t *str;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  DataPointer *in_stack_fffffffffffffe18;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe20;
  DomItem *this_00;
  QString *in_stack_fffffffffffffe28;
  QAnyStringView *pQVar6;
  DomProperty *in_stack_fffffffffffffe30;
  QAnyStringView *in_stack_fffffffffffffe38;
  undefined1 local_148 [24];
  DomItem **local_130;
  const_iterator local_128;
  const_iterator local_120;
  undefined1 local_118 [24];
  DomProperty **local_100;
  const_iterator local_f8;
  const_iterator local_f0;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  undefined1 local_98 [64];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1b180f);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"item",4);
    QString::QString((QString *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffe18);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  QXmlStreamWriter::writeStartElement(str_00);
  QString::~QString((QString *)0x1b18d1);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe20);
  }
  bVar1 = hasAttributeRow(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    iVar2 = attributeRow(this);
    QString::number((int)local_98,iVar2);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    QXmlStreamWriter::writeAttribute(str_00,local_58);
    QString::~QString((QString *)0x1b199c);
    QString::~QString((QString *)0x1b19a9);
  }
  bVar1 = hasAttributeColumn(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    iVar2 = attributeColumn(this);
    QString::number((int)local_e8,iVar2);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    QXmlStreamWriter::writeAttribute(str_00,local_a8);
    QString::~QString((QString *)0x1b1a5e);
    QString::~QString((QString *)0x1b1a6b);
  }
  sVar5 = 0xaaaaaaaaaaaaaaaa;
  local_f0.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_f0 = QList<DomProperty_*>::begin((QList<DomProperty_*> *)in_stack_fffffffffffffe20);
  local_f8.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_f8 = QList<DomProperty_*>::end((QList<DomProperty_*> *)in_stack_fffffffffffffe20);
  while( true ) {
    local_100 = local_f8.i;
    bVar1 = QList<DomProperty_*>::const_iterator::operator!=(&local_f0,local_f8);
    if (!bVar1) break;
    ppDVar3 = QList<DomProperty_*>::const_iterator::operator*(&local_f0);
    in_stack_fffffffffffffe30 = *ppDVar3;
    in_stack_fffffffffffffe38 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffe30);
    DomProperty::write(in_stack_fffffffffffffe30,(int)in_stack_fffffffffffffe38,local_118,sVar5);
    QString::~QString((QString *)0x1b1b5b);
    QList<DomProperty_*>::const_iterator::operator++(&local_f0);
  }
  sVar5 = 0xaaaaaaaaaaaaaaaa;
  local_120.i = (DomItem **)0xaaaaaaaaaaaaaaaa;
  local_120 = QList<DomItem_*>::begin((QList<DomItem_*> *)in_stack_fffffffffffffe20);
  local_128.i = (DomItem **)0xaaaaaaaaaaaaaaaa;
  local_128 = QList<DomItem_*>::end((QList<DomItem_*> *)in_stack_fffffffffffffe20);
  while( true ) {
    local_130 = local_128.i;
    bVar1 = QList<DomItem_*>::const_iterator::operator!=(&local_120,local_128);
    if (!bVar1) break;
    ppDVar4 = QList<DomItem_*>::const_iterator::operator*(&local_120);
    this_00 = *ppDVar4;
    pQVar6 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
    write(this_00,(int)pQVar6,local_148,sVar5);
    QString::~QString((QString *)0x1b1c5d);
    QList<DomItem_*>::const_iterator::operator++(&local_120);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomItem::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("item") : tagName.toLower());

    if (hasAttributeRow())
        writer.writeAttribute(u"row"_s, QString::number(attributeRow()));

    if (hasAttributeColumn())
        writer.writeAttribute(u"column"_s, QString::number(attributeColumn()));

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomItem *v : m_item)
        v->write(writer, u"item"_s);

    writer.writeEndElement();
}